

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

int EventThread(ALCcontext *context)

{
  uint uVar1;
  RingBuffer *this;
  ALEVENTPROCSOFT p_Var2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  void *__src;
  RingBuffer *__stat_loc;
  long lVar8;
  string msg;
  AsyncEvent evt;
  string local_50;
  
  this = (context->mAsyncEvents)._M_t.
         super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
         super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
         super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
  do {
    while( true ) {
      __stat_loc = this;
      RingBuffer::getReadVector((ll_ringbuffer_data_pair *)&evt,this);
      lVar8 = CONCAT44(evt.u.srcstate.state,evt.u.srcstate.id);
      if (lVar8 != 0) break;
      al::semaphore::wait(&context->mEventSem,__stat_loc);
    }
    __src = (void *)CONCAT44(evt._4_4_,evt.EnumType);
    std::mutex::lock(&context->mEventCbLock);
    do {
      memcpy(&evt,__src,0x100);
      RingBuffer::readAdvance(this,1);
      uVar6 = evt.u.user.param;
      uVar5 = evt.u.srcstate.state;
      uVar4 = evt.u.srcstate.id;
      uVar3 = evt.EnumType;
      if (evt.EnumType == 0) break;
      if (evt.EnumType == 0x10000) {
        al::intrusive_ref<EffectState>::release
                  ((intrusive_ref<EffectState> *)
                   (CONCAT44(evt.u.srcstate.state,evt.u.srcstate.id) + 8));
      }
      else {
        uVar1 = (context->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
        p_Var2 = context->mEventCb;
        if (p_Var2 != (ALEVENTPROCSOFT)0x0) {
          if (evt.EnumType == 2) {
            if ((uVar1 & 2) != 0) {
              std::__cxx11::to_string(&msg,evt.u.bufcomp.count);
              std::__cxx11::string::append((char *)&msg);
              (*context->mEventCb)
                        (0x19a4,evt.u.srcstate.id,evt.u.srcstate.state,(ALsizei)msg._M_string_length
                         ,msg._M_dataplus._M_p,context->mEventParam);
LAB_0011cbd9:
              std::__cxx11::string::~string((string *)&msg);
            }
          }
          else if (evt.EnumType == 1) {
            if ((uVar1 & 1) != 0) {
              std::__cxx11::to_string(&local_50,evt.u.srcstate.id);
              std::operator+(&msg,"Source ID ",&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::append((char *)&msg);
              std::__cxx11::string::append((char *)&msg);
              (*context->mEventCb)
                        (0x19a5,evt.u.srcstate.id,evt.u.srcstate.state,(ALsizei)msg._M_string_length
                         ,msg._M_dataplus._M_p,context->mEventParam);
              goto LAB_0011cbd9;
            }
          }
          else if ((evt.EnumType & ~uVar1) == 0) {
            sVar7 = strlen(evt.u.user.msg);
            (*p_Var2)(uVar4,uVar5,uVar6,(ALsizei)sVar7,evt.u.user.msg,context->mEventParam);
          }
        }
      }
      __src = (void *)((long)__src + 0x100);
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    pthread_mutex_unlock((pthread_mutex_t *)&context->mEventCbLock);
    if (uVar3 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int EventThread(ALCcontext *context)
{
    RingBuffer *ring{context->mAsyncEvents.get()};
    bool quitnow{false};
    while LIKELY(!quitnow)
    {
        auto evt_data = ring->getReadVector().first;
        if(evt_data.len == 0)
        {
            context->mEventSem.wait();
            continue;
        }

        std::lock_guard<std::mutex> _{context->mEventCbLock};
        do {
            auto *evt_ptr = reinterpret_cast<AsyncEvent*>(evt_data.buf);
            evt_data.buf += sizeof(AsyncEvent);
            evt_data.len -= 1;

            AsyncEvent evt{*evt_ptr};
            al::destroy_at(evt_ptr);
            ring->readAdvance(1);

            quitnow = evt.EnumType == EventType_KillThread;
            if UNLIKELY(quitnow) break;

            if(evt.EnumType == EventType_ReleaseEffectState)
            {
                evt.u.mEffectState->release();
                continue;
            }

            ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_acquire)};
            if(!context->mEventCb) continue;

            if(evt.EnumType == EventType_SourceStateChange)
            {
                if(!(enabledevts&EventType_SourceStateChange))
                    continue;
                std::string msg{"Source ID " + std::to_string(evt.u.srcstate.id)};
                msg += " state has changed to ";
                msg += (evt.u.srcstate.state==AL_INITIAL) ? "AL_INITIAL" :
                    (evt.u.srcstate.state==AL_PLAYING) ? "AL_PLAYING" :
                    (evt.u.srcstate.state==AL_PAUSED) ? "AL_PAUSED" :
                    (evt.u.srcstate.state==AL_STOPPED) ? "AL_STOPPED" : "<unknown>";
                context->mEventCb(AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT, evt.u.srcstate.id,
                    static_cast<ALuint>(evt.u.srcstate.state), static_cast<ALsizei>(msg.length()),
                    msg.c_str(), context->mEventParam);
            }
            else if(evt.EnumType == EventType_BufferCompleted)
            {
                if(!(enabledevts&EventType_BufferCompleted))
                    continue;
                std::string msg{std::to_string(evt.u.bufcomp.count)};
                if(evt.u.bufcomp.count == 1) msg += " buffer completed";
                else msg += " buffers completed";
                context->mEventCb(AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT, evt.u.bufcomp.id,
                    evt.u.bufcomp.count, static_cast<ALsizei>(msg.length()), msg.c_str(),
                    context->mEventParam);
            }
            else if((enabledevts&evt.EnumType) == evt.EnumType)
                context->mEventCb(evt.u.user.type, evt.u.user.id, evt.u.user.param,
                    static_cast<ALsizei>(strlen(evt.u.user.msg)), evt.u.user.msg,
                    context->mEventParam);
        } while(evt_data.len != 0);
    }